

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::UnlockResources(cmCTestMultiProcessHandler *this,int index)

{
  _Rb_tree_header *p_Var1;
  mapped_type pcVar2;
  pointer puVar3;
  PropertiesMap *this_00;
  mapped_type *ppcVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  pointer puVar7;
  size_t sVar8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar9;
  unsigned_long p;
  unsigned_long local_48;
  int local_3c;
  PropertiesMap *local_38;
  
  local_38 = &this->Properties;
  local_3c = index;
  ppcVar4 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_38->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_3c);
  pcVar2 = *ppcVar4;
  puVar7 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar3) {
    do {
      local_48 = *puVar7;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&this->ProcessorsAvailable,&local_48);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar3);
  }
  this_00 = local_38;
  puVar7 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  p_Var5 = (pcVar2->ProjectResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pcVar2->ProjectResources)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      pVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::equal_range(&(this->ProjectResourcesLocked)._M_t,(key_type *)(p_Var5 + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_aux(&(this->ProjectResourcesLocked)._M_t,(_Base_ptr)pVar9.first._M_node,
                     (_Base_ptr)pVar9.second._M_node);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  if (pcVar2->RunSerial != false) {
    this->SerialTestRunning = false;
  }
  local_48 = CONCAT44(local_48._4_4_,local_3c);
  ppcVar4 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)&local_48);
  uVar6 = (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value;
  if (uVar6 == 0) {
    uVar6 = 0x10000;
  }
  if (((this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged == false) &&
     (uVar6 = 0x10000,
     (this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
     super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
     super__Optional_payload_base<cmUVJobServerClient>._M_engaged == false)) {
    uVar6 = this->ParallelLevelDefault;
  }
  sVar8 = (long)(*ppcVar4)->Processors;
  if (uVar6 < (ulong)(long)(*ppcVar4)->Processors) {
    sVar8 = uVar6;
  }
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < sVar8)) &&
     (ppcVar4 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_00->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)&local_48), (*ppcVar4)->WantAffinity != false)) {
    sVar8 = this->HaveAffinity;
  }
  this->RunningCount = this->RunningCount - sVar8;
  return;
}

Assistant:

void cmCTestMultiProcessHandler::UnlockResources(int index)
{
  auto* properties = this->Properties[index];

  for (auto p : properties->Affinity) {
    this->ProcessorsAvailable.insert(p);
  }
  properties->Affinity.clear();

  for (std::string const& i : properties->ProjectResources) {
    this->ProjectResourcesLocked.erase(i);
  }

  if (properties->RunSerial) {
    this->SerialTestRunning = false;
  }

  this->RunningCount -= this->GetProcessorsUsed(index);
}